

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardKinematics.cpp
# Opt level: O0

bool iDynTree::ForwardBiasAccKinematics
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,SpatialAcc *baseBiasAcc,LinkVelArray *linkVel,
               LinkAccArray *linkBiasAcc)

{
  undefined8 uVar1;
  uint uVar2;
  Link *this;
  Link *this_00;
  IJoint *pIVar3;
  SpatialAcc *this_01;
  JointPosDoubleArray *pJVar4;
  JointDOFsDoubleArray *pJVar5;
  LinkIndex LVar6;
  FreeFloatingVel *in_RCX;
  FreeFloatingPos *in_RDX;
  SpatialAcc *in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  uint traversalEl;
  bool retValue;
  LinkIndex in_stack_ffffffffffffff58;
  Traversal *in_stack_ffffffffffffff60;
  uint local_38;
  
  local_38 = 0;
  while( true ) {
    uVar2 = Traversal::getNrOfVisitedLinks((Traversal *)0x3b92be);
    if (uVar2 <= local_38) break;
    this = Traversal::getLink(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    this_00 = Traversal::getParentLink(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    pIVar3 = Traversal::getParentJoint(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (this_00 == (Link *)0x0) {
      Link::getIndex(this);
      this_01 = LinkAccArray::operator()
                          ((LinkAccArray *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      iDynTree::SpatialAcc::operator=(this_01,in_R8);
    }
    else {
      pJVar4 = FreeFloatingPos::jointPos(in_RDX);
      pJVar5 = FreeFloatingVel::jointVel(in_RCX);
      uVar1 = in_stack_00000008;
      LVar6 = Link::getIndex(this);
      in_stack_ffffffffffffff58 = Link::getIndex(this_00);
      (*pIVar3->_vptr_IJoint[0x11])(pIVar3,pJVar4,pJVar5,in_R9,uVar1,LVar6);
    }
    local_38 = local_38 + 1;
  }
  return true;
}

Assistant:

bool ForwardBiasAccKinematics(const Model& model,
                              const Traversal& traversal,
                              const FreeFloatingPos & robotPos,
                              const FreeFloatingVel & robotVel,
                              const SpatialAcc& baseBiasAcc,
                              const LinkVelArray & linkVel,
                                    LinkAccArray & linkBiasAcc)
{
    bool retValue = true;

    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the bias acceleration is tipically zero,
            // or in strange cases the one specified by the baseBiasAcc argument
            linkBiasAcc(visitedLink->getIndex()) = baseBiasAcc;
        }
        else
        {
            // Otherwise we compute the child velocity and acceleration from parent
            toParentJoint->computeChildBiasAcc(robotPos.jointPos(),
                                               robotVel.jointVel(),
                                               linkVel, linkBiasAcc,
                                               visitedLink->getIndex(),
                                               parentLink->getIndex());
        }

    }

    return retValue;
}